

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::Directory> __thiscall
kj::Directory::openSubdir(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *pDVar1;
  ulong in_R8;
  Own<const_kj::Directory> OVar2;
  Fault f_1;
  Directory *local_50;
  OwnOwn<const_kj::Directory> f;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x88))(&f_1);
  f.value.disposer = (Disposer *)f_1.exception;
  f.value.ptr = local_50;
  Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&f_1);
  if (local_50 == (Directory *)0x0) {
    if ((in_R8 & 1) == 0) {
      if ((in_R8 & 2) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x266,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                   &path_local);
        kj::_::Debug::Fault::~Fault(&f_1);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x264,FAILED,(char *)0x0,"\"directory does not exist\", path",
                   (char (*) [25])"directory does not exist",&path_local);
        kj::_::Debug::Fault::~Fault(&f_1);
      }
    }
    else if ((in_R8 & 2) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x262,FAILED,(char *)0x0,"\"directory already exists\", path",
                 (char (*) [25])"directory already exists",&path_local);
      kj::_::Debug::Fault::~Fault(&f_1);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x269,FAILED,(char *)0x0,
                 "\"tryOpenSubdir() returned null despite no preconditions\", path",
                 (char (*) [55])"tryOpenSubdir() returned null despite no preconditions",&path_local
                );
      kj::_::Debug::Fault::~Fault(&f_1);
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f_1.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)local_50;
    f.value.ptr = (Directory *)0x0;
  }
  Own<const_kj::Directory>::dispose(&f.value);
  pDVar1 = extraout_RDX;
  if (local_50 == (Directory *)0x0) {
    clock = nullClock();
    newInMemoryDirectory((kj *)&f,clock);
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.value.disposer;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)f.value.ptr;
    f.value.ptr = (Directory *)0x0;
    Own<kj::Directory>::dispose((Own<kj::Directory> *)&f);
    pDVar1 = extraout_RDX_00;
  }
  OVar2.ptr = pDVar1;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const Directory> Directory::openSubdir(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryOpenSubdir(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("directory already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("directory does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenSubdir() returned null despite no preconditions", path) { break; }